

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Block * __thiscall SQCompilation::SQParser::parseStatements(SQParser *this)

{
  SQParser *pSVar1;
  Block *pBVar2;
  SQParser *in_RDI;
  bool bVar3;
  Statement *stmt;
  Block *result;
  NestingChecker nc;
  bool in_stack_00000147;
  SQParser *in_stack_00000148;
  SQParser *in_stack_ffffffffffffff98;
  NestingChecker *in_stack_ffffffffffffffa0;
  NestingChecker local_18;
  
  NestingChecker::NestingChecker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pSVar1 = (SQParser *)arena(in_RDI);
  pBVar2 = newNode<SQCompilation::Block,Arena*>(pSVar1,(Arena *)in_RDI);
  while( true ) {
    bVar3 = false;
    if ((in_RDI->_token != 0x7d) && (bVar3 = false, in_RDI->_token != 0x12d)) {
      bVar3 = in_RDI->_token != 300;
    }
    if (!bVar3) break;
    pSVar1 = (SQParser *)parseStatement(in_stack_00000148,in_stack_00000147);
    Block::addStatement((Block *)pSVar1,(Statement *)in_stack_ffffffffffffff98);
    if (((in_RDI->_lex)._prevtoken != 0x7d) && ((in_RDI->_lex)._prevtoken != 0x3b)) {
      OptionalSemicolon(pSVar1);
    }
  }
  NestingChecker::~NestingChecker(&local_18);
  return pBVar2;
}

Assistant:

Block* SQParser::parseStatements()
{
    NestingChecker nc(this);
    Block *result = newNode<Block>(arena());
    while(_token != _SC('}') && _token != TK_DEFAULT && _token != TK_CASE) {
        Statement *stmt = parseStatement();
        result->addStatement(stmt);
        if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
    }
    return result;
}